

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void finish(cbify *data)

{
  action_score *__ptr;
  example *peVar1;
  float *__ptr_00;
  pointer ppeVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  ulong uVar7;
  
  (*(code *)PTR_delete_label_002f0300)();
  __ptr = (data->a_s)._begin;
  if (__ptr != (action_score *)0x0) {
    free(__ptr);
  }
  (data->a_s)._begin = (action_score *)0x0;
  (data->a_s)._end = (action_score *)0x0;
  (data->a_s).end_array = (action_score *)0x0;
  if (data->use_adf == true) {
    if ((data->adf_data).num_actions != 0) {
      uVar7 = 0;
      do {
        peVar1 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7];
        __ptr_00 = (peVar1->pred).scalars._begin;
        if (__ptr_00 != (float *)0x0) {
          free(__ptr_00);
        }
        (peVar1->pred).scalars._begin = (float *)0x0;
        (peVar1->pred).scalars._end = (float *)0x0;
        (peVar1->pred).scalars.end_array = (float *)0x0;
        VW::dealloc_example((_func_void_void_ptr *)PTR_delete_label_002f0300,
                            (data->adf_data).ecs.
                            super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],(_func_void_void_ptr *)0x0);
        peVar1 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar7];
        if (peVar1 != (example *)0x0) {
          free(peVar1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (data->adf_data).num_actions);
    }
    ppeVar2 = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (ppeVar2 != (pointer)0x0) {
      operator_delete(ppeVar2);
    }
    pvVar3 = (data->cs_costs).
             super__Vector_base<v_array<COST_SENSITIVE::wclass>,_std::allocator<v_array<COST_SENSITIVE::wclass>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar3 != (pointer)0x0) {
      operator_delete(pvVar3);
    }
    pvVar4 = (data->cb_costs).
             super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pvVar4 != (pointer)0x0) {
      operator_delete(pvVar4);
    }
    pvVar6 = (data->cb_as).
             super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (data->cb_as).
             super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar6 != pvVar5) {
      do {
        if (pvVar6->_begin != (action_score *)0x0) {
          free(pvVar6->_begin);
        }
        pvVar6 = pvVar6 + 1;
      } while (pvVar6 != pvVar5);
      pvVar6 = (data->cb_as).
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pvVar6 != (pointer)0x0) {
      operator_delete(pvVar6);
      return;
    }
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();

  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
      {
        data.adf_data.ecs[a]->pred.a_s.delete_v();
        VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
        free_it(data.adf_data.ecs[a]);
      }
    data.adf_data.ecs.~vector<example*>();
    data.cs_costs.~vector<v_array<COST_SENSITIVE::wclass>>();
    data.cb_costs.~vector<v_array<CB::cb_class>>();
    for (auto as : data.cb_as)
      as.delete_v();
    data.cb_as.~vector<ACTION_SCORE::action_scores>();
  }
}